

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O2

void test_maximal_dimension<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>
               (Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>
                *m)

{
  undefined4 local_10c;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_108;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  char *local_a0;
  pair<unsigned_int,_unsigned_int> local_98;
  ulong uStack_90;
  undefined8 *local_88;
  char *pcStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_60;
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_48;
  
  local_a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_a0 = "";
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a8,0x39f);
  uStack_90 = uStack_90 & 0xffffffffffffff00;
  local_98 = (pair<unsigned_int,_unsigned_int>)&PTR__lazy_ostream_001fe050;
  local_88 = &boost::unit_test::lazy_ostream::inst;
  pcStack_80 = "";
  local_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_c0 = "";
  local_108._M_array =
       (iterator)
       CONCAT44(local_108._M_array._4_4_,(m->matrix_).super_Matrix_dimension_option.maxDim_);
  local_10c = 2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_98,&local_c8,0x39f,1,2,&local_108,"m.get_max_dimension()",&local_10c,"2");
  local_98.first = 0;
  local_98.second = 1;
  uStack_90 = 0x400000001;
  local_88 = (undefined8 *)0x100000002;
  pcStack_80 = (char *)0x400000003;
  local_78 = 0x100000004;
  uStack_70 = 0x400000005;
  local_108._M_len = 6;
  local_108._M_array = &local_98;
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Insertion_return *)&local_48,
             (Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>
              *)m,&local_108,-1);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&local_48);
  local_98.first = 0;
  local_98.second = 1;
  uStack_90 = 0x400000001;
  local_88 = (undefined8 *)0x100000002;
  pcStack_80 = (char *)0x400000003;
  local_108._M_len = 4;
  local_108._M_array = &local_98;
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Insertion_return *)&local_60,
             (Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>
              *)m,&local_108,-1);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&local_60);
  local_d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_d0 = "";
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d8,0x3a9);
  uStack_90 = uStack_90 & 0xffffffffffffff00;
  local_98 = (pair<unsigned_int,_unsigned_int>)&PTR__lazy_ostream_001fe050;
  local_88 = &boost::unit_test::lazy_ostream::inst;
  pcStack_80 = "";
  local_f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_f0 = "";
  local_108._M_array =
       (iterator)
       CONCAT44(local_108._M_array._4_4_,(m->matrix_).super_Matrix_dimension_option.maxDim_);
  local_10c = 5;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_98,&local_f8,0x3a9,1,2,&local_108,"m.get_max_dimension()",&local_10c,"5");
  return;
}

Assistant:

void test_maximal_dimension(Matrix& m) {
  BOOST_CHECK_EQUAL(m.get_max_dimension(), 2);

  if constexpr (Matrix::Option_list::is_z2) {
    m.insert_boundary({0, 1, 2, 3, 4, 5});
    m.insert_boundary({0, 1, 2, 3});
  } else {
    m.insert_boundary({{0, 1}, {1, 4}, {2, 1}, {3, 4}, {4, 1}, {5, 4}});
    m.insert_boundary({{0, 1}, {1, 4}, {2, 1}, {3, 4}});
  }

  BOOST_CHECK_EQUAL(m.get_max_dimension(), 5);

  if constexpr (Matrix::Option_list::has_vine_update &&
                (Matrix::Option_list::is_of_boundary_type ||
                 (Matrix::Option_list::has_map_column_container && Matrix::Option_list::has_column_pairings))) {
    m.remove_maximal_cell(7);
    BOOST_CHECK_EQUAL(m.get_max_dimension(), 3);
  }
}